

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbe_c.hpp
# Opt level: O1

void ExchCXX::kernel_traits<ExchCXX::BuiltinPBE_C>::eval_exc_vxc_unpolar_impl
               (double rho,double sigma,double *eps,double *vrho,double *vsigma)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar20;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  double dVar32;
  double dVar33;
  undefined8 local_a8;
  undefined8 uStack_a0;
  
  dVar32 = cbrt(rho);
  dVar21 = 2.4814019635975995 / dVar32;
  dVar26 = SQRT(dVar21);
  dVar8 = dVar26;
  dVar16 = dVar26;
  if (dVar21 < 0.0) {
    dVar16 = sqrt(dVar21);
    dVar8 = sqrt(dVar21);
  }
  dVar8 = dVar8 * dVar8 * dVar8;
  dVar9 = 1.5393389262365056 / (dVar32 * dVar32);
  dVar10 = dVar9 * 0.123235 + dVar8 * 0.204775 + dVar16 * 3.79785 + dVar21 * 0.8969;
  dVar33 = 16.081979498692537 / dVar10 + 1.0;
  dVar1 = log(dVar33);
  dVar11 = dVar9 * 0.1241775 + dVar8 * 0.1100325 + dVar16 * 5.1785 + dVar21 * 0.905775;
  dVar8 = 29.608749977793437 / dVar11 + 1.0;
  dVar2 = log(dVar8);
  dVar20 = dVar21 * 0.053425 + 1.0;
  dVar22 = (dVar21 * 0.0278125 + 1.0) * 0.0;
  dVar12 = dVar2 * dVar22 - dVar1 * dVar20 * 0.0621814;
  dVar3 = exp(dVar12 * -32.16396844291482);
  dVar13 = dVar3 + -1.0;
  dVar6 = 1.0 / dVar13;
  dVar14 = dVar6 * 32.16396844291482 * 0.06672455060314922;
  dVar31 = sigma * sigma * dVar14;
  auVar17._0_8_ = rho * rho;
  auVar19._8_8_ = dVar32 * dVar32;
  auVar19._0_8_ = dVar32;
  auVar29 = divpd(_DAT_01041040,auVar19);
  auVar17._8_8_ = auVar17._0_8_ * auVar17._0_8_;
  auVar30 = divpd(auVar29,auVar17);
  dVar27 = auVar30._8_8_ * 1.5874010519681996 * 7.795554179441513;
  auVar18._0_8_ = sigma * auVar30._0_8_ * 1.2599210498948732 * 4.83597586204941;
  auVar18._8_8_ = dVar31 * dVar27;
  auVar19 = divpd(auVar18,_DAT_010411e0);
  dVar23 = auVar19._8_8_ + auVar19._0_8_;
  dVar7 = dVar6 * 2.1461263399673647 * dVar23 + 1.0;
  dVar15 = (1.0 / dVar7) * 32.16396844291482;
  dVar32 = dVar23 * 0.06672455060314922 * dVar15 + 1.0;
  dVar4 = log(dVar32);
  if (dVar21 < 0.0) {
    dVar26 = sqrt(dVar21);
  }
  local_a8 = auVar29._0_8_;
  uStack_a0 = auVar29._8_8_;
  auVar24._8_8_ = local_a8;
  auVar24._0_8_ = 0x3ff0000000000000;
  auVar5._8_4_ = SUB84(rho,0);
  auVar5._0_8_ = dVar16;
  auVar5._12_4_ = (int)((ulong)rho >> 0x20);
  auVar19 = divpd(auVar24,auVar5);
  dVar25 = auVar19._8_8_;
  dVar16 = auVar19._0_8_ * 1.4422495703074083 * dVar25 * 1.720508027656199;
  dVar26 = dVar25 * 1.720508027656199 * dVar26 * 1.4422495703074083;
  dVar28 = dVar25 * 2.519842099789747 * 0.9847450218426962;
  auVar29._8_4_ = SUB84(dVar33,0);
  auVar29._0_8_ = dVar10 * dVar10;
  auVar29._12_4_ = (int)((ulong)dVar33 >> 0x20);
  auVar19 = divpd(_DAT_01041040,auVar29);
  dVar21 = 1.0 / (dVar13 * dVar13);
  dVar26 = ((((dVar9 / rho) * -0.08215666666666667 +
             dVar26 * -0.1023875 + dVar16 * -0.632975 + dVar28 * -0.29896666666666666) *
             auVar19._8_8_ * dVar20 * auVar19._0_8_ + dVar1 * dVar28 * 0.0011073470983333333) -
           dVar2 * dVar25 * 0.0 * 0.00018311447306006544) -
           dVar22 * (1.0 / dVar8) *
                    ((dVar9 / rho) * -0.082785 +
                    dVar26 * -0.05501625 + dVar16 * -0.8630833333333333 + dVar28 * -0.301925) *
                    (1.0 / (dVar11 * dVar11)) * 0.5848223622634646;
  dVar33 = dVar31 * -0.0015190972222222222 *
           (uStack_a0 / (auVar17._0_8_ * auVar17._0_8_ * rho)) * 1.5874010519681996 *
           7.795554179441513 +
           sigma * -0.024305555555555556 * (local_a8 / (auVar17._0_8_ * rho)) * 1.2599210498948732 *
           4.83597586204941 +
           (dVar26 * dVar3 * 5.405135380126985 * 2.2894284851066637 *
           auVar30._8_8_ * dVar21 * sigma * sigma * 69.0279398732186) / 3072.0;
  dVar8 = 1.0 / (dVar7 * dVar7);
  dVar32 = 1.0 / dVar32;
  auVar30._0_8_ = auVar30._0_8_ * 1.2599210498948732 * 4.83597586204941;
  auVar30._8_8_ = dVar27 * sigma * dVar14;
  auVar19 = divpd(auVar30,_DAT_01041380);
  dVar16 = auVar19._8_8_ + auVar19._0_8_;
  dVar12 = dVar12 + dVar4 * 0.031090690869654894;
  *eps = dVar12;
  *vrho = ((dVar23 * 0.06672455060314922 *
            (dVar21 * 69.0279398732186 * dVar23 * dVar26 * dVar3 +
            dVar6 * 2.1461263399673647 * dVar33) * dVar8 * -32.16396844291482 +
           dVar33 * 0.06672455060314922 * dVar15) * 0.031090690869654894 * dVar32 + dVar26) * rho +
          dVar12;
  *vsigma = (dVar16 * 0.06672455060314922 * dVar15 +
            dVar23 * 0.004452165653192221 * -1034.5208659968205 * dVar6 * dVar8 * dVar16) *
            rho * 0.031090690869654894 * dVar32;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_unpolar_impl( double rho, double sigma, double& eps, double& vrho, double& vsigma ) {

    (void)(eps);
    constexpr double t1 = constants::m_cbrt_3;
    constexpr double t3 = constants::m_cbrt_one_ov_pi;
    constexpr double t5 = constants::m_cbrt_4;
    constexpr double t39 = constants::m_cbrt_2;
    constexpr double t4 = t1 * t3;
    constexpr double t6 = t5 * t5;
    constexpr double t18 = t1 * t1;
    constexpr double t19 = t3 * t3;
    constexpr double t20 = t18 * t19;
    constexpr double t70 = 0.1e1 / t3;
    constexpr double t75 = BB * beta;
    constexpr double t76 = 0.1e1 / gamma;
    constexpr double t91 = t39 * t39;
    constexpr double t96 = 0.1e1 / t19;
    constexpr double t97 = t1 * t96;
    constexpr double t98 = t97 * t6;
    constexpr double t104 = beta * t76;
    constexpr double t125 = t3 * t6;
    constexpr double t170 = gamma * gamma;
    constexpr double t171 = 0.1e1 / t170;
    constexpr double t172 = t75 * t171;
    constexpr double t182 = t96 * t6;
    constexpr double t224 = t18 * t70 * t5;
    constexpr double t234 = beta * beta;


    const double t7 = safe_math::cbrt( rho );
    const double t10 = t4 * t6 / t7;
    const double t12 = 0.1e1 + 0.53425e-1 * t10;
    const double t13 = safe_math::sqrt( t10 );
    const double t16 = pow_3_2( t10 );
    const double t21 = t7 * t7;
    const double t24 = t20 * t5 / t21;
    const double t26 = 0.379785e1 * t13 + 0.8969e0 * t10 + 0.204775e0 * t16 + 0.123235e0 * t24;
    const double t29 = 0.1e1 + 0.16081979498692535067e2 / t26;
    const double t30 = safe_math::log( t29 );
    const double t32 = 0.621814e-1 * t12 * t30;
    const double t33 = 0.1e1 <= zeta_tol;
    const double t34 = safe_math::cbrt( zeta_tol );
    const double t36 = piecewise_functor_3( t33, t34 * zeta_tol, 1.0 );
    const double t43 = ( 0.2e1 * t36 - 0.2e1 ) / ( 0.2e1 * t39 - 0.2e1 );
    const double t45 = 0.1e1 + 0.278125e-1 * t10;
    const double t50 = 0.51785e1 * t13 + 0.905775e0 * t10 + 0.1100325e0 * t16 + 0.1241775e0 * t24;
    const double t53 = 0.1e1 + 0.29608749977793437516e2 / t50;
    const double t54 = safe_math::log( t53 );
    const double t57 = 0.19751673498613801407e-1 * t43 * t45 * t54;
    const double t58 = t34 * t34;
    const double t59 = piecewise_functor_3( t33, t58, 1.0 );
    const double t60 = t59 * t59;
    const double t61 = t60 * t59;
    const double t62 = gamma * t61;
    const double t63 = rho * rho;
    const double t65 = 0.1e1 / t7 / t63;
    const double t68 = 0.1e1 / t60;
    const double t72 = t68 * t18 * t70 * t5;
    const double t79 = 0.1e1 / t61;
    const double t81 = safe_math::exp( -( -t32 + t57 ) * t76 * t79 );
    const double t82 = t81 - 0.1e1;
    const double t83 = 0.1e1 / t82;
    const double t84 = t76 * t83;
    const double t85 = sigma * sigma;
    const double t87 = t75 * t84 * t85;
    const double t88 = t63 * t63;
    const double t90 = 0.1e1 / t21 / t88;
    const double t92 = t90 * t91;
    const double t93 = t60 * t60;
    const double t94 = 0.1e1 / t93;
    const double t95 = t92 * t94;
    const double t99 = t95 * t98;
    const double t102 = sigma * t65 * t39 * t72 / 0.96e2 + t87 * t99 / 0.3072e4;
    const double t103 = beta * t102;
    const double t107 = t104 * t83 * t102 + 0.1e1;
    const double t108 = 0.1e1 / t107;
    const double t109 = t76 * t108;
    const double t111 = t103 * t109 + 0.1e1;
    const double t112 = safe_math::log( t111 );
    const double t113 = t62 * t112;
    const double t115 = 0.1e1 / t7 / rho;
    const double t116 = t6 * t115;
    const double t118 = t4 * t116 * t30;
    const double t119 = 0.11073470983333333333e-2 * t118;
    const double t120 = t26 * t26;
    const double t121 = 0.1e1 / t120;
    const double t122 = t12 * t121;
    const double t124 = 0.1e1 / t13 * t1;
    const double t126 = t125 * t115;
    const double t127 = t124 * t126;
    const double t129 = t4 * t116;
    const double t131 = safe_math::sqrt( t10 );
    const double t132 = t131 * t1;
    const double t133 = t132 * t126;
    const double t138 = t20 * t5 / t21 / rho;
    const double t140 = -0.632975e0 * t127 - 0.29896666666666666667e0 * t129 - 0.1023875e0 * t133 - 0.82156666666666666667e-1 * t138;
    const double t141 = 0.1e1 / t29;
    const double t142 = t140 * t141;
    const double t143 = t122 * t142;
    const double t144 = 0.1e1 * t143;
    const double t145 = t43 * t1;
    const double t148 = t145 * t125 * t115 * t54;
    const double t149 = 0.18311447306006545054e-3 * t148;
    const double t150 = t43 * t45;
    const double t151 = t50 * t50;
    const double t152 = 0.1e1 / t151;
    const double t157 = -0.86308333333333333334e0 * t127 - 0.301925e0 * t129 - 0.5501625e-1 * t133 - 0.82785e-1 * t138;
    const double t159 = 0.1e1 / t53;
    const double t160 = t152 * t157 * t159;
    const double t161 = t150 * t160;
    const double t162 = 0.5848223622634646207e0 * t161;
    const double t163 = t63 * rho;
    const double t165 = 0.1e1 / t7 / t163;
    const double t173 = t82 * t82;
    const double t174 = 0.1e1 / t173;
    const double t175 = t174 * t85;
    const double t176 = t175 * t90;
    const double t177 = t172 * t176;
    const double t179 = 0.1e1 / t93 / t61;
    const double t180 = t91 * t179;
    const double t181 = t180 * t1;
    const double t183 = t119 + t144 - t149 - t162;
    const double t184 = t183 * t81;
    const double t185 = t182 * t184;
    const double t186 = t181 * t185;
    const double t189 = t88 * rho;
    const double t191 = 0.1e1 / t21 / t189;
    const double t192 = t191 * t91;
    const double t193 = t192 * t94;
    const double t194 = t193 * t98;
    const double t197 = -0.7e1 / 0.288e3 * sigma * t165 * t39 * t72 + t177 * t186 / 0.3072e4 - 0.7e1 / 0.4608e4 * t87 * t194;
    const double t198 = beta * t197;
    const double t200 = t107 * t107;
    const double t201 = 0.1e1 / t200;
    const double t202 = t76 * t201;
    const double t204 = beta * t171 * t174;
    const double t206 = t79 * t81;
    const double t211 = t204 * t102 * t183 * t206 + t104 * t83 * t197;
    const double t212 = t202 * t211;
    const double t214 = -t103 * t212 + t198 * t109;
    const double t215 = 0.1e1 / t111;
    const double t217 = t62 * t214 * t215;
    const double t220 = rho * gamma;
    const double t228 = t75 * t84 * sigma;
    const double t231 = t65 * t39 * t68 * t224 / 0.96e2 + t228 * t99 / 0.1536e4;
    const double t232 = beta * t231;
    const double t235 = t234 * t102;
    const double t236 = t235 * t171;
    const double t237 = t201 * t83;
    const double t238 = t237 * t231;
    const double t240 = t232 * t109 - t236 * t238;


    eps = -t32 + t57 + t113;
    vrho = -t32 + t57 + t113 + rho * ( t119 + t144 - t149 - t162 + t217 );
    vsigma = t220 * t61 * t240 * t215;

  }